

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::Close(cmServerBase *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  int in_R8D;
  cmServerBase *this_local;
  
  if ((this->Loop).data != (void *)0x0) {
    if ((this->ServeThreadRunning & 1U) != 0) {
      ::cm::uv_async_ptr::send(&this->ShutdownSignal,in_ESI,in_RDX,in_RCX,in_R8D);
      uv_thread_join(&this->ServeThread);
    }
    uv_loop_close(&this->Loop);
    (this->Loop).data = (void *)0x0;
  }
  return;
}

Assistant:

void cmServerBase::Close()
{
  if (Loop.data) {
    if (ServeThreadRunning) {
      this->ShutdownSignal.send();
      uv_thread_join(&ServeThread);
    }

    uv_loop_close(&Loop);
    Loop.data = nullptr;
  }
}